

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::clear(Calendar *this)

{
  int local_14;
  int32_t i;
  Calendar *this_local;
  
  for (local_14 = 0; local_14 < 0x17; local_14 = local_14 + 1) {
    this->fFields[local_14] = 0;
    this->fStamp[local_14] = 0;
    this->fIsSet[local_14] = '\0';
  }
  this->fAreFieldsVirtuallySet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fIsTimeSet = '\0';
  return;
}

Assistant:

void
Calendar::clear()
{
    for (int32_t i=0; i<UCAL_FIELD_COUNT; ++i) {
        fFields[i]     = 0; // Must do this; other code depends on it
        fStamp[i]     = kUnset;
        fIsSet[i]     = FALSE; // Remove later
    }
    fIsTimeSet = fAreFieldsSet = fAreAllFieldsSet = fAreFieldsVirtuallySet = FALSE;
    // fTime is not 'cleared' - may be used if no fields are set.
}